

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  value_type pSVar1;
  bool bVar2;
  size_type sVar3;
  reference ppSVar4;
  ulong uVar5;
  StackInst **prev;
  Index j;
  StackInst *inst_1;
  Index i_1;
  StackInst *inst;
  Index i;
  bool inUnreachableCode;
  StackIROptimizer *this_local;
  
  inst._7_1_ = 0;
  _i = this;
  for (inst._0_4_ = 0; uVar5 = (ulong)(uint)inst,
      sVar3 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts),
      uVar5 < sVar3; inst._0_4_ = (uint)inst + 1) {
    ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                        (this->insts,(ulong)(uint)inst);
    _i_1 = *ppSVar4;
    if (_i_1 != (StackInst *)0x0) {
      if ((inst._7_1_ & 1) == 0) {
        inst_1._4_4_ = 1;
        bVar2 = wasm::Type::operator==(&_i_1->type,(BasicType *)((long)&inst_1 + 4));
        if (bVar2) {
          inst._7_1_ = 1;
        }
      }
      else {
        bVar2 = isControlFlowBarrier(this,_i_1);
        if (bVar2) {
          inst._7_1_ = 0;
        }
        else {
          removeAt(this,(uint)inst);
        }
      }
    }
  }
  for (inst_1._0_4_ = 1; uVar5 = (ulong)(uint)inst_1,
      sVar3 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts),
      uVar5 < sVar3; inst_1._0_4_ = (uint)inst_1 + 1) {
    ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                        (this->insts,(ulong)(uint)inst_1);
    pSVar1 = *ppSVar4;
    if (((pSVar1 != (value_type)0x0) && (pSVar1->op == Basic)) &&
       (bVar2 = Expression::is<wasm::Unreachable>(pSVar1->origin), prev._4_4_ = (uint)inst_1, bVar2)
       ) {
      do {
        prev._4_4_ = prev._4_4_ - 1;
        bVar2 = false;
        if (prev._4_4_ != 0) {
          ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                              (this->insts,(ulong)prev._4_4_);
          bVar2 = *ppSVar4 == (value_type)0x0;
        }
      } while (bVar2);
      ppSVar4 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                          (this->insts,(ulong)prev._4_4_);
      if (((*ppSVar4 != (value_type)0x0) && ((*ppSVar4)->op == Basic)) &&
         (bVar2 = Expression::is<wasm::Drop>((*ppSVar4)->origin), bVar2)) {
        *ppSVar4 = (value_type)0x0;
      }
    }
  }
  return;
}

Assistant:

void StackIROptimizer::dce() {
  // Remove code after an unreachable instruction: anything after it, up to the
  // next control flow barrier, can simply be removed.
  bool inUnreachableCode = false;
  for (Index i = 0; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (inUnreachableCode) {
      // Does the unreachable code end here?
      if (isControlFlowBarrier(inst)) {
        inUnreachableCode = false;
      } else {
        // We can remove this.
        removeAt(i);
      }
    } else if (inst->type == Type::unreachable) {
      inUnreachableCode = true;
    }
  }

  // Remove code before an Unreachable. Consider this:
  //
  //  (drop
  //   ..
  //  )
  //  (unreachable)
  //
  // The drop is not needed, as the unreachable puts the stack in the
  // polymorphic state anyhow. Note that we don't need to optimize anything
  // other than a drop here, as in general the Binaryen IR DCE pass will handle
  // everything else. A drop followed by an unreachable is the only thing that
  // pass cannot handle, as the structured form of Binaryen IR does not allow
  // removing such a drop, and so we can only do it here in StackIR.
  //
  // TODO: We can look even further back, say if there is another drop of
  //       something before, then we can remove that drop as well. To do that
  //       we'd need to inspect the stack going backwards.
  for (Index i = 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst || inst->op != StackInst::Basic ||
        !inst->origin->is<Unreachable>()) {
      continue;
    }

    // Look back past nulls.
    Index j = i - 1;
    while (j > 0 && !insts[j]) {
      j--;
    }

    auto*& prev = insts[j];
    if (prev && prev->op == StackInst::Basic && prev->origin->is<Drop>()) {
      prev = nullptr;
    }
  }
}